

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * LoadDDS(Image *__return_storage_ptr__,uchar *fileData,uint fileSize)

{
  undefined1 uVar1;
  ushort uVar2;
  int iVar3;
  void *pvVar4;
  uchar *__src;
  int local_60;
  int local_5c;
  int dataSize_5;
  int i_2;
  uchar blue;
  int dataSize_4;
  int dataSize_3;
  int i_1;
  int iStack_40;
  uchar alpha_1;
  int dataSize_2;
  int i;
  uchar alpha;
  int dataSize_1;
  int dataSize;
  DDSHeader *ddsHeader;
  uchar *ddsHeaderId;
  uchar *fileDataPtr;
  uint fileSize_local;
  uchar *fileData_local;
  
  memset(__return_storage_ptr__,0,0x18);
  if (fileData != (uchar *)0x0) {
    if ((((*fileData == 'D') && (fileData[1] == 'D')) && (fileData[2] == 'S')) &&
       (fileData[3] == ' ')) {
      __src = fileData + 0x80;
      __return_storage_ptr__->width = *(int *)(fileData + 0x10);
      __return_storage_ptr__->height = *(int *)(fileData + 0xc);
      if (*(int *)(fileData + 0x1c) == 0) {
        __return_storage_ptr__->mipmaps = 1;
      }
      else {
        __return_storage_ptr__->mipmaps = *(int *)(fileData + 0x1c);
      }
      if (*(int *)(fileData + 0x58) == 0x10) {
        if (*(int *)(fileData + 0x50) == 0x40) {
          iVar3 = __return_storage_ptr__->width * __return_storage_ptr__->height * 2;
          pvVar4 = malloc((long)iVar3);
          __return_storage_ptr__->data = pvVar4;
          memcpy(__return_storage_ptr__->data,__src,(long)iVar3);
          __return_storage_ptr__->format = 3;
        }
        else if (*(int *)(fileData + 0x50) == 0x41) {
          if (*(int *)(fileData + 0x68) == 0x8000) {
            iVar3 = __return_storage_ptr__->width * __return_storage_ptr__->height * 2;
            pvVar4 = malloc((long)iVar3);
            __return_storage_ptr__->data = pvVar4;
            memcpy(__return_storage_ptr__->data,__src,(long)iVar3);
            for (iStack_40 = 0;
                iStack_40 < __return_storage_ptr__->width * __return_storage_ptr__->height;
                iStack_40 = iStack_40 + 1) {
              uVar2 = *(ushort *)((long)__return_storage_ptr__->data + (long)iStack_40 * 2);
              *(short *)((long)__return_storage_ptr__->data + (long)iStack_40 * 2) =
                   *(short *)((long)__return_storage_ptr__->data + (long)iStack_40 * 2) << 1;
              *(ushort *)((long)__return_storage_ptr__->data + (long)iStack_40 * 2) =
                   *(short *)((long)__return_storage_ptr__->data + (long)iStack_40 * 2) +
                   (ushort)(byte)((int)(uint)uVar2 >> 0xf);
            }
            __return_storage_ptr__->format = 5;
          }
          else if (*(int *)(fileData + 0x68) == 0xf000) {
            iVar3 = __return_storage_ptr__->width * __return_storage_ptr__->height * 2;
            pvVar4 = malloc((long)iVar3);
            __return_storage_ptr__->data = pvVar4;
            memcpy(__return_storage_ptr__->data,__src,(long)iVar3);
            for (dataSize_4 = 0;
                dataSize_4 < __return_storage_ptr__->width * __return_storage_ptr__->height;
                dataSize_4 = dataSize_4 + 1) {
              uVar2 = *(ushort *)((long)__return_storage_ptr__->data + (long)dataSize_4 * 2);
              *(short *)((long)__return_storage_ptr__->data + (long)dataSize_4 * 2) =
                   *(short *)((long)__return_storage_ptr__->data + (long)dataSize_4 * 2) << 4;
              *(ushort *)((long)__return_storage_ptr__->data + (long)dataSize_4 * 2) =
                   *(short *)((long)__return_storage_ptr__->data + (long)dataSize_4 * 2) +
                   (ushort)(byte)((int)(uint)uVar2 >> 0xc);
            }
            __return_storage_ptr__->format = 6;
          }
        }
      }
      else if ((*(int *)(fileData + 0x50) == 0x40) && (*(int *)(fileData + 0x58) == 0x18)) {
        iVar3 = __return_storage_ptr__->width * __return_storage_ptr__->height * 3;
        pvVar4 = malloc((long)iVar3);
        __return_storage_ptr__->data = pvVar4;
        memcpy(__return_storage_ptr__->data,__src,(long)iVar3);
        __return_storage_ptr__->format = 4;
      }
      else if ((*(int *)(fileData + 0x50) == 0x41) && (*(int *)(fileData + 0x58) == 0x20)) {
        iVar3 = __return_storage_ptr__->width * __return_storage_ptr__->height * 4;
        pvVar4 = malloc((long)iVar3);
        __return_storage_ptr__->data = pvVar4;
        memcpy(__return_storage_ptr__->data,__src,(long)iVar3);
        for (local_5c = 0;
            local_5c < __return_storage_ptr__->width * __return_storage_ptr__->height * 4;
            local_5c = local_5c + 4) {
          uVar1 = *(undefined1 *)((long)__return_storage_ptr__->data + (long)local_5c);
          *(undefined1 *)((long)__return_storage_ptr__->data + (long)local_5c) =
               *(undefined1 *)((long)__return_storage_ptr__->data + (long)(local_5c + 2));
          *(undefined1 *)((long)__return_storage_ptr__->data + (long)(local_5c + 2)) = uVar1;
        }
        __return_storage_ptr__->format = 7;
      }
      else if (((*(int *)(fileData + 0x50) == 4) || (*(int *)(fileData + 0x50) == 5)) &&
              (*(int *)(fileData + 0x54) != 0)) {
        if (*(uint *)(fileData + 0x1c) < 2) {
          local_60 = *(int *)(fileData + 0x14);
        }
        else {
          local_60 = *(int *)(fileData + 0x14) << 1;
        }
        pvVar4 = malloc((long)local_60);
        __return_storage_ptr__->data = pvVar4;
        memcpy(__return_storage_ptr__->data,__src,(long)local_60);
        iVar3 = *(int *)(fileData + 0x54);
        if (iVar3 == 0x31545844) {
          if (*(int *)(fileData + 0x50) == 4) {
            __return_storage_ptr__->format = 0xb;
          }
          else {
            __return_storage_ptr__->format = 0xc;
          }
        }
        else if (iVar3 == 0x33545844) {
          __return_storage_ptr__->format = 0xd;
        }
        else if (iVar3 == 0x35545844) {
          __return_storage_ptr__->format = 0xe;
        }
      }
    }
    else {
      TraceLog(4,"IMAGE: DDS file data not valid");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Image LoadDDS(const unsigned char *fileData, unsigned int fileSize)
{
    unsigned char *fileDataPtr = (unsigned char *)fileData;

    // Required extension:
    // GL_EXT_texture_compression_s3tc

    // Supported tokens (defined by extensions)
    // GL_COMPRESSED_RGB_S3TC_DXT1_EXT      0x83F0
    // GL_COMPRESSED_RGBA_S3TC_DXT1_EXT     0x83F1
    // GL_COMPRESSED_RGBA_S3TC_DXT3_EXT     0x83F2
    // GL_COMPRESSED_RGBA_S3TC_DXT5_EXT     0x83F3

    #define FOURCC_DXT1 0x31545844  // Equivalent to "DXT1" in ASCII
    #define FOURCC_DXT3 0x33545844  // Equivalent to "DXT3" in ASCII
    #define FOURCC_DXT5 0x35545844  // Equivalent to "DXT5" in ASCII

    // DDS Pixel Format
    typedef struct {
        unsigned int size;
        unsigned int flags;
        unsigned int fourCC;
        unsigned int rgbBitCount;
        unsigned int rBitMask;
        unsigned int gBitMask;
        unsigned int bBitMask;
        unsigned int aBitMask;
    } DDSPixelFormat;

    // DDS Header (124 bytes)
    typedef struct {
        unsigned int size;
        unsigned int flags;
        unsigned int height;
        unsigned int width;
        unsigned int pitchOrLinearSize;
        unsigned int depth;
        unsigned int mipmapCount;
        unsigned int reserved1[11];
        DDSPixelFormat ddspf;
        unsigned int caps;
        unsigned int caps2;
        unsigned int caps3;
        unsigned int caps4;
        unsigned int reserved2;
    } DDSHeader;

    Image image = { 0 };

    if (fileDataPtr != NULL)
    {
        // Verify the type of file
        unsigned char *ddsHeaderId = fileDataPtr;
        fileDataPtr += 4;

        if ((ddsHeaderId[0] != 'D') || (ddsHeaderId[1] != 'D') || (ddsHeaderId[2] != 'S') || (ddsHeaderId[3] != ' '))
        {
            TRACELOG(LOG_WARNING, "IMAGE: DDS file data not valid");
        }
        else
        {
            DDSHeader *ddsHeader = (DDSHeader *)fileDataPtr;

            TRACELOGD("IMAGE: DDS file data info:");
            TRACELOGD("    > Header size:        %i", sizeof(DDSHeader));
            TRACELOGD("    > Pixel format size:  %i", ddsHeader->ddspf.size);
            TRACELOGD("    > Pixel format flags: 0x%x", ddsHeader->ddspf.flags);
            TRACELOGD("    > File format:        0x%x", ddsHeader->ddspf.fourCC);
            TRACELOGD("    > File bit count:     0x%x", ddsHeader->ddspf.rgbBitCount);

            fileDataPtr += sizeof(DDSHeader);   // Skip header

            image.width = ddsHeader->width;
            image.height = ddsHeader->height;

            if (ddsHeader->mipmapCount == 0) image.mipmaps = 1;      // Parameter not used
            else image.mipmaps = ddsHeader->mipmapCount;

            if (ddsHeader->ddspf.rgbBitCount == 16)     // 16bit mode, no compressed
            {
                if (ddsHeader->ddspf.flags == 0x40)         // no alpha channel
                {
                    int dataSize = image.width*image.height*sizeof(unsigned short);
                    image.data = (unsigned short *)RL_MALLOC(dataSize);

                    memcpy(image.data, fileDataPtr, dataSize);

                    image.format = PIXELFORMAT_UNCOMPRESSED_R5G6B5;
                }
                else if (ddsHeader->ddspf.flags == 0x41)        // with alpha channel
                {
                    if (ddsHeader->ddspf.aBitMask == 0x8000)    // 1bit alpha
                    {
                        int dataSize = image.width*image.height*sizeof(unsigned short);
                        image.data = (unsigned short *)RL_MALLOC(dataSize);

                        memcpy(image.data, fileDataPtr, dataSize);

                        unsigned char alpha = 0;

                        // NOTE: Data comes as A1R5G5B5, it must be reordered to R5G5B5A1
                        for (int i = 0; i < image.width*image.height; i++)
                        {
                            alpha = ((unsigned short *)image.data)[i] >> 15;
                            ((unsigned short *)image.data)[i] = ((unsigned short *)image.data)[i] << 1;
                            ((unsigned short *)image.data)[i] += alpha;
                        }

                        image.format = PIXELFORMAT_UNCOMPRESSED_R5G5B5A1;
                    }
                    else if (ddsHeader->ddspf.aBitMask == 0xf000)   // 4bit alpha
                    {
                        int dataSize = image.width*image.height*sizeof(unsigned short);
                        image.data = (unsigned short *)RL_MALLOC(dataSize);

                        memcpy(image.data, fileDataPtr, dataSize);

                        unsigned char alpha = 0;

                        // NOTE: Data comes as A4R4G4B4, it must be reordered R4G4B4A4
                        for (int i = 0; i < image.width*image.height; i++)
                        {
                            alpha = ((unsigned short *)image.data)[i] >> 12;
                            ((unsigned short *)image.data)[i] = ((unsigned short *)image.data)[i] << 4;
                            ((unsigned short *)image.data)[i] += alpha;
                        }

                        image.format = PIXELFORMAT_UNCOMPRESSED_R4G4B4A4;
                    }
                }
            }
            else if (ddsHeader->ddspf.flags == 0x40 && ddsHeader->ddspf.rgbBitCount == 24)   // DDS_RGB, no compressed
            {
                int dataSize = image.width*image.height*3*sizeof(unsigned char);
                image.data = (unsigned short *)RL_MALLOC(dataSize);

                memcpy(image.data, fileDataPtr, dataSize);

                image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8;
            }
            else if (ddsHeader->ddspf.flags == 0x41 && ddsHeader->ddspf.rgbBitCount == 32) // DDS_RGBA, no compressed
            {
                int dataSize = image.width*image.height*4*sizeof(unsigned char);
                image.data = (unsigned short *)RL_MALLOC(dataSize);

                memcpy(image.data, fileDataPtr, dataSize);

                unsigned char blue = 0;

                // NOTE: Data comes as A8R8G8B8, it must be reordered R8G8B8A8 (view next comment)
                // DirecX understand ARGB as a 32bit DWORD but the actual memory byte alignment is BGRA
                // So, we must realign B8G8R8A8 to R8G8B8A8
                for (int i = 0; i < image.width*image.height*4; i += 4)
                {
                    blue = ((unsigned char *)image.data)[i];
                    ((unsigned char *)image.data)[i] = ((unsigned char *)image.data)[i + 2];
                    ((unsigned char *)image.data)[i + 2] = blue;
                }

                image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
            }
            else if (((ddsHeader->ddspf.flags == 0x04) || (ddsHeader->ddspf.flags == 0x05)) && (ddsHeader->ddspf.fourCC > 0)) // Compressed
            {
                int dataSize = 0;

                // Calculate data size, including all mipmaps
                if (ddsHeader->mipmapCount > 1) dataSize = ddsHeader->pitchOrLinearSize*2;
                else dataSize = ddsHeader->pitchOrLinearSize;

                image.data = (unsigned char *)RL_MALLOC(dataSize*sizeof(unsigned char));

                memcpy(image.data, fileDataPtr, dataSize);

                switch (ddsHeader->ddspf.fourCC)
                {
                    case FOURCC_DXT1:
                    {
                        if (ddsHeader->ddspf.flags == 0x04) image.format = PIXELFORMAT_COMPRESSED_DXT1_RGB;
                        else image.format = PIXELFORMAT_COMPRESSED_DXT1_RGBA;
                    } break;
                    case FOURCC_DXT3: image.format = PIXELFORMAT_COMPRESSED_DXT3_RGBA; break;
                    case FOURCC_DXT5: image.format = PIXELFORMAT_COMPRESSED_DXT5_RGBA; break;
                    default: break;
                }
            }
        }
    }

    return image;
}